

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-path.c
# Opt level: O0

float plutovg_path_extents(plutovg_path_t *path,plutovg_rect_t *extents,_Bool tight)

{
  undefined8 local_3c;
  extents_calculator_t calculator;
  _Bool tight_local;
  plutovg_rect_t *extents_local;
  plutovg_path_t *path_local;
  
  local_3c = 0;
  calculator.current_point.x = 1.4013e-45;
  calculator.current_point.y = 0.0;
  calculator.is_first_point = false;
  calculator._9_3_ = 0;
  calculator.length = 0.0;
  calculator.x1 = 0.0;
  calculator.y1 = 0.0;
  calculator.x2._3_1_ = tight;
  unique0x10000098 = extents;
  if (tight) {
    plutovg_path_traverse_flatten(path,extents_traverse_func,&local_3c);
  }
  else {
    plutovg_path_traverse(path,extents_traverse_func,&local_3c);
  }
  if (stack0xffffffffffffffe8 != (plutovg_rect_t *)0x0) {
    stack0xffffffffffffffe8->x = (float)calculator._8_4_;
    stack0xffffffffffffffe8->y = calculator.length;
    stack0xffffffffffffffe8->w = calculator.x1 - (float)calculator._8_4_;
    stack0xffffffffffffffe8->h = calculator.y1 - calculator.length;
  }
  return calculator.current_point.y;
}

Assistant:

float plutovg_path_extents(const plutovg_path_t* path, plutovg_rect_t* extents, bool tight)
{
    extents_calculator_t calculator = {{0, 0}, true, 0, 0, 0, 0, 0};
    if(tight) {
        plutovg_path_traverse_flatten(path, extents_traverse_func, &calculator);
    } else {
        plutovg_path_traverse(path, extents_traverse_func, &calculator);
    }

    if(extents) {
        extents->x = calculator.x1;
        extents->y = calculator.y1;
        extents->w = calculator.x2 - calculator.x1;
        extents->h = calculator.y2 - calculator.y1;
    }

    return calculator.length;
}